

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_destroy(Curl_hash *h)

{
  long lVar1;
  long lVar2;
  
  if (0 < h->slots) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      Curl_llist_destroy((Curl_llist *)((long)&h->table->head + lVar1),h);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (lVar2 < h->slots);
  }
  (*Curl_cfree)(h->table);
  h->table = (Curl_llist *)0x0;
  h->size = 0;
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  int i;

  for(i = 0; i < h->slots; ++i) {
    Curl_llist_destroy(&h->table[i], (void *) h);
  }

  Curl_safefree(h->table);
  h->size = 0;
  h->slots = 0;
}